

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

QDir __thiscall QFileInfo::absoluteDir(QFileInfo *this)

{
  long lVar1;
  QSharedDataPointer<QDirPrivate> in_RDI;
  long in_FS_OFFSET;
  QSharedDataPointer<QDirPrivate> path;
  QSharedDataPointer<QFileInfoPrivate> in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  path.d.ptr = in_RDI.d.ptr;
  absolutePath((QFileInfo *)&stack0xffffffffffffffe0);
  QDir::QDir((QDir *)in_stack_ffffffffffffffe0.d.ptr,(QString *)path.d.ptr);
  QString::~QString((QString *)0x2ac59c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSharedDataPointer<QDirPrivate>)(QSharedDataPointer<QDirPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QDir QFileInfo::absoluteDir() const
{
    return QDir(absolutePath());
}